

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_assertion_tests.cpp
# Opt level: O2

void __thiscall
iu_ExpressionMacro_x_iutest_x_True_Test::Body(iu_ExpressionMacro_x_iutest_x_True_Test *this)

{
  ScopedSPITestFlag SVar1;
  TestFlag *pTVar2;
  char *in_R9;
  ScopedSPITestFlag guard_1;
  undefined1 local_328 [40];
  iuCodeMessage local_300;
  int local_2d0 [4];
  SPIFailureChecker iutest_failure_checker;
  AssertionResult iutest_ar;
  AssertionResult iutest_spi_ar;
  ScopedSPITestFlag guard;
  AssertionResult iutest_spi_ar_1;
  undefined1 local_1e8 [40];
  ExpressionResult local_1c0;
  Fixed local_198;
  
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  local_1c0.m_result.m_message._M_dataplus._M_p._0_4_ = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS
            ((ExpressionLHS<int> *)local_328,(int *)&local_1c0);
  local_1e8._0_4_ = 0x2a;
  iutest::detail::ExpressionLHS<int>::operator!=
            ((ExpressionResult *)&local_300,(ExpressionLHS<int> *)local_328,(int *)local_1e8);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)&local_198,(ExpressionResult *)&local_300);
  iutest::AssertionResult::AssertionResult(&iutest_ar,(AssertionResult *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::~string((string *)(local_328 + 8));
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&iutest_ar,
               (AssertionResult *)"IUTEST_EXPRESSION(f() != 42)","false","true",in_R9);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_300,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0xed,(char *)local_328._0_8_);
    local_300._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_300,&local_198);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)local_328);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  pTVar2 = iutest::TestFlag::GetInstance();
  pTVar2->m_test_flags = (int)guard.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"42 != 42",(allocator<char> *)&local_300);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0xed,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_failure_checker,&local_198);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_1);
  local_2d0[3] = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS
            ((ExpressionLHS<int> *)&iutest_spi_ar,local_2d0 + 3);
  local_2d0[2] = 0x2a;
  iutest::detail::ExpressionLHS<int>::operator!=
            ((ExpressionResult *)local_328,(ExpressionLHS<int> *)&iutest_spi_ar,local_2d0 + 2);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)&local_300,(ExpressionResult *)local_328);
  local_2d0[1] = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS((ExpressionLHS<int> *)local_1e8,local_2d0 + 1);
  local_2d0[0] = 10;
  iutest::detail::ExpressionLHS<int>::operator!=
            (&local_1c0,(ExpressionLHS<int> *)local_1e8,local_2d0);
  iutest::detail::ExpressionResult::GetResult((AssertionResult *)&guard,&local_1c0);
  iutest::AssertionResult::operator&&
            ((AssertionResult *)&local_198,(AssertionResult *)&local_300,(AssertionResult *)&guard);
  iutest::AssertionResult::AssertionResult(&iutest_ar,(AssertionResult *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&guard);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)(local_1e8 + 8));
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::~string((string *)local_328);
  std::__cxx11::string::~string((string *)&iutest_spi_ar.m_message._M_string_length);
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&iutest_ar,
               (AssertionResult *)"IUTEST_EXPRESSION(f() != 42) && IUTEST_EXPRESSION(f() != 10)",
               "false","true",in_R9);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_300,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0xee,(char *)local_328._0_8_);
    local_300._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_300,&local_198);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)local_328);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar1 = guard_1;
  pTVar2 = iutest::TestFlag::GetInstance();
  pTVar2->m_test_flags = (int)SVar1.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"42 != 42 && 42 != 10",(allocator<char> *)&local_300);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar_1,&iutest_failure_checker,(string *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar_1.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0xee,iutest_spi_ar_1.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_failure_checker,&local_198);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar_1);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_1);
  local_2d0[3] = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS
            ((ExpressionLHS<int> *)&iutest_spi_ar,local_2d0 + 3);
  local_2d0[2] = 0x2a;
  iutest::detail::ExpressionLHS<int>::operator!=
            ((ExpressionResult *)local_328,(ExpressionLHS<int> *)&iutest_spi_ar,local_2d0 + 2);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)&local_300,(ExpressionResult *)local_328);
  local_2d0[1] = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS((ExpressionLHS<int> *)local_1e8,local_2d0 + 1);
  local_2d0[0] = 10;
  iutest::detail::ExpressionLHS<int>::operator==
            (&local_1c0,(ExpressionLHS<int> *)local_1e8,local_2d0);
  iutest::detail::ExpressionResult::GetResult((AssertionResult *)&guard,&local_1c0);
  iutest::AssertionResult::operator||
            ((AssertionResult *)&local_198,(AssertionResult *)&local_300,(AssertionResult *)&guard);
  iutest::AssertionResult::AssertionResult(&iutest_ar,(AssertionResult *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&guard);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)(local_1e8 + 8));
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::~string((string *)local_328);
  std::__cxx11::string::~string((string *)&iutest_spi_ar.m_message._M_string_length);
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&iutest_ar,
               (AssertionResult *)"IUTEST_EXPRESSION(f() != 42) || IUTEST_EXPRESSION(f() == 10)",
               "false","true",in_R9);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_300,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0xef,(char *)local_328._0_8_);
    local_300._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_300,&local_198);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)local_328);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  pTVar2 = iutest::TestFlag::GetInstance();
  pTVar2->m_test_flags = (int)guard_1.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"42 != 42 || 42 == 10",(allocator<char> *)&local_300);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar_1,&iutest_failure_checker,(string *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar_1.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0xef,iutest_spi_ar_1.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_failure_checker,&local_198);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar_1);
  return;
}

Assistant:

IUTEST(ExpressionMacro, True)
{
    CHECK_FATAL_FAILURE( IUTEST_ASSERT_TRUE(IUTEST_EXPRESSION(f() != 42)), "42 != 42");
    CHECK_FATAL_FAILURE( IUTEST_ASSERT_TRUE(IUTEST_EXPRESSION(f() != 42) && IUTEST_EXPRESSION(f() != 10)), "42 != 42 && 42 != 10");
    CHECK_FATAL_FAILURE( IUTEST_ASSERT_TRUE(IUTEST_EXPRESSION(f() != 42) || IUTEST_EXPRESSION(f() == 10)), "42 != 42 || 42 == 10");
}